

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFGen<(moira::Instr)149,(moira::Mode)8,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  uint uVar1;
  
  *addr = *addr + 2;
  uVar1 = (*this->_vptr_Moira[6])();
  *addr = *addr - 2;
  (*(code *)(&DAT_00473754 + *(int *)(&DAT_00473754 + (ulong)((uVar1 & 0xffff) >> 0xd) * 4)))();
  return;
}

Assistant:

void
Moira::dasmFGen(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext  = dasmIncRead<Word>(addr);
    auto cod  = xxx_____________(ext);
    auto cmd  = _________xxxxxxx(ext);
    addr -= 2;

    if (M == Mode::AN) {
        if (ext & 0x4000) { dasmLineF<I, M, S>(str, addr, op); return; }
    }
    if (M == Mode::IP) {
        if (cod == 0b010) { dasmLineF<I, M, S>(str, addr, op); return; }
    }

    // Catch FMOVE instructions
    switch (cod) {

        case 0b010:

            if ((ext & 0xFC00) == 0x5C00) { dasmFMovecr<Instr::FMOVECR, M, S>(str, addr, op); return; }
            [[fallthrough]];

        case 0b000:

            if (cmd != 0x00 && cmd != 0x40 && cmd != 0x44) break;
            [[fallthrough]];

        case 0b011:

            dasmFMove<Instr::FMOVE, M, S>(str, addr, op);
            return;

        case 0b101:
        case 0b100:
        case 0b110:
        case 0b111:

            dasmFMovem<Instr::FMOVEM, M, S>(str, addr, op);
            return;
    }

    // Catch all other instructions
    switch (cod) {

        case 0b010:
        case 0b000:

            switch (cmd) {

                case 0x01: dasmFGeneric<Instr::FINT, M, S>(str, addr, op); return;
                case 0x02: dasmFGeneric<Instr::FSINH, M, S>(str, addr, op); return;
                case 0x03: dasmFGeneric<Instr::FINTRZ, M, S>(str, addr, op); return;
                case 0x04: dasmFGeneric<Instr::FSQRT, M, S>(str, addr, op); return;
                case 0x06: dasmFGeneric<Instr::FLOGNP1, M, S>(str, addr, op); return;
                case 0x08: dasmFGeneric<Instr::FETOXM1, M, S>(str, addr, op); return;
                case 0x09: dasmFGeneric<Instr::FTANH, M, S>(str, addr, op); return;
                case 0x0A: dasmFGeneric<Instr::FATAN, M, S>(str, addr, op); return;
                case 0x0C: dasmFGeneric<Instr::FASIN, M, S>(str, addr, op); return;
                case 0x0D: dasmFGeneric<Instr::FATANH, M, S>(str, addr, op); return;
                case 0x0E: dasmFGeneric<Instr::FSIN, M, S>(str, addr, op); return;
                case 0x0F: dasmFGeneric<Instr::FTAN, M, S>(str, addr, op); return;
                case 0x10: dasmFGeneric<Instr::FETOX, M, S>(str, addr, op); return;
                case 0x11: dasmFGeneric<Instr::FTWOTOX, M, S>(str, addr, op); return;
                case 0x12: dasmFGeneric<Instr::FTENTOX, M, S>(str, addr, op); return;
                case 0x14: dasmFGeneric<Instr::FLOGN, M, S>(str, addr, op); return;
                case 0x15: dasmFGeneric<Instr::FLOG10, M, S>(str, addr, op); return;
                case 0x16: dasmFGeneric<Instr::FLOG2, M, S>(str, addr, op); return;
                case 0x18: dasmFGeneric<Instr::FABS, M, S>(str, addr, op); return;
                case 0x19: dasmFGeneric<Instr::FCOSH, M, S>(str, addr, op); return;
                case 0x1A: dasmFGeneric<Instr::FNEG, M, S>(str, addr, op); return;
                case 0x1C: dasmFGeneric<Instr::FACOS, M, S>(str, addr, op); return;
                case 0x1D: dasmFGeneric<Instr::FCOS, M, S>(str, addr, op); return;
                case 0x1E: dasmFGeneric<Instr::FGETEXP, M, S>(str, addr, op); return;
                case 0x1F: dasmFGeneric<Instr::FGETMAN, M, S>(str, addr, op); return;
                case 0x20: dasmFGeneric<Instr::FDIV, M, S>(str, addr, op); return;
                case 0x21: dasmFGeneric<Instr::FMOD, M, S>(str, addr, op); return;
                case 0x22: dasmFGeneric<Instr::FADD, M, S>(str, addr, op); return;
                case 0x23: dasmFGeneric<Instr::FMUL, M, S>(str, addr, op); return;
                case 0x24: dasmFGeneric<Instr::FSGLDIV, M, S>(str, addr, op); return;
                case 0x25: dasmFGeneric<Instr::FREM, M, S>(str, addr, op); return;
                case 0x26: dasmFGeneric<Instr::FSCAL, M, S>(str, addr, op); return;
                case 0x27: dasmFGeneric<Instr::FSGLMUL, M, S>(str, addr, op); return;
                case 0x28: dasmFGeneric<Instr::FSUB, M, S>(str, addr, op); return;
                case 0x30: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x31: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x32: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x33: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x34: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x35: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x36: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x37: dasmFGeneric2<Instr::FSINCOS, M, S>(str, addr, op); return;
                case 0x38: dasmFGeneric<Instr::FCMP, M, S>(str, addr, op); return;
                case 0x3A: dasmFGeneric3<Instr::FTST, M, S>(str, addr, op); return;
            }

            // 68040 only instructions
            if (hasFPU()) {

                switch (cmd) {

                    case 0x41: dasmFGeneric<Instr::FSSQRT, M, S>(str, addr, op); return;
                    case 0x45: dasmFGeneric<Instr::FDSQRT, M, S>(str, addr, op); return;
                    case 0x58: dasmFGeneric<Instr::FSABS, M, S>(str, addr, op); return;
                    case 0x5A: dasmFGeneric<Instr::FSNEG, M, S>(str, addr, op); return;
                    case 0x5C: dasmFGeneric<Instr::FDABS, M, S>(str, addr, op); return;
                    case 0x5E: dasmFGeneric<Instr::FDNEG, M, S>(str, addr, op); return;
                    case 0x60: dasmFGeneric<Instr::FSDIV, M, S>(str, addr, op); return;
                    case 0x62: dasmFGeneric<Instr::FSADD, M, S>(str, addr, op); return;
                    case 0x63: dasmFGeneric<Instr::FSMUL, M, S>(str, addr, op); return;
                    case 0x64: dasmFGeneric<Instr::FDDIV, M, S>(str, addr, op); return;
                    case 0x66: dasmFGeneric<Instr::FDADD, M, S>(str, addr, op); return;
                    case 0x67: dasmFGeneric<Instr::FDMUL, M, S>(str, addr, op); return;
                    case 0x68: dasmFGeneric<Instr::FSSUB, M, S>(str, addr, op); return;
                    case 0x6C: dasmFGeneric<Instr::FDSUB, M, S>(str, addr, op); return;
                }
            }

            break;
    }

    dasmLineF<I, M, S>(str, addr, op);
}